

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembler.cpp
# Opt level: O0

void __thiscall Assembler::processWordSecondPass(Assembler *this,string *line)

{
  bool bVar1;
  int value_00;
  NotDefWordSecondPassError *this_00;
  NotDefSymbol *this_01;
  pointer ppVar2;
  mapped_type *pmVar3;
  AfterWordError *this_02;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assembler::symbolTableEntry>_>
  local_230;
  allocator<char> local_221;
  string local_220;
  allocator<char> local_1f9;
  string local_1f8;
  undefined1 local_1d8 [8];
  relocationTableEntry rT_1;
  allocator<char> local_179;
  string local_178;
  allocator<char> local_151;
  string local_150;
  undefined1 local_130 [8];
  relocationTableEntry rT;
  iterator iStack_d0;
  int value_2;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assembler::symbolTableEntry>_>
  local_c8;
  int local_bc;
  iterator iStack_b8;
  int value_1;
  _Self local_b0;
  _Self local_a8;
  _Self local_a0;
  _Self local_98;
  undefined1 local_90 [8];
  smatch symbol;
  string local_68;
  int local_48;
  int value;
  undefined1 local_38 [8];
  smatch literal;
  string *line_local;
  Assembler *this_local;
  
  literal._M_begin._M_current = (char *)line;
  std::__cxx11::
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::match_results((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   *)local_38);
  bVar1 = std::
          regex_match<std::char_traits<char>,std::allocator<char>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>>
                    (line,(match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                           *)local_38,&literalReg_abi_cxx11_,0);
  if (bVar1) {
    std::__cxx11::string::string((string *)&local_68,(string *)line);
    value_00 = literalToDecimal(this,&local_68);
    std::__cxx11::string::~string((string *)&local_68);
    local_48 = value_00;
    processWordHelper(this,value_00);
    locationCounter = locationCounter + 2;
    symbol._M_begin._M_current._4_4_ = 1;
  }
  else {
    std::__cxx11::
    match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::match_results((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                     *)local_90);
    local_98._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assembler::symbolTableEntry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assembler::symbolTableEntry>_>_>
         ::find(&this->symbolTable,line);
    local_a0._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assembler::symbolTableEntry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assembler::symbolTableEntry>_>_>
         ::end(&this->symbolTable);
    bVar1 = std::operator==(&local_98,&local_a0);
    if (bVar1) {
      this_00 = (NotDefWordSecondPassError *)__cxa_allocate_exception(8);
      *this_00 = (NotDefWordSecondPassError)0x0;
      NotDefWordSecondPassError::NotDefWordSecondPassError(this_00);
      __cxa_throw(this_00,&NotDefWordSecondPassError::typeinfo,
                  NotDefWordSecondPassError::~NotDefWordSecondPassError);
    }
    bVar1 = std::
            regex_match<std::char_traits<char>,std::allocator<char>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>>
                      (line,(match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                             *)local_90,&symbolReg_abi_cxx11_,0);
    if (!bVar1) {
      this_02 = (AfterWordError *)__cxa_allocate_exception(8);
      *this_02 = (AfterWordError)0x0;
      AfterWordError::AfterWordError(this_02);
      __cxa_throw(this_02,&AfterWordError::typeinfo,AfterWordError::~AfterWordError);
    }
    local_a8._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assembler::symbolTableEntry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assembler::symbolTableEntry>_>_>
         ::find(&this->symbolTable,line);
    local_b0._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assembler::symbolTableEntry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assembler::symbolTableEntry>_>_>
         ::end(&this->symbolTable);
    bVar1 = std::operator==(&local_a8,&local_b0);
    if (bVar1) {
      this_01 = (NotDefSymbol *)__cxa_allocate_exception(8);
      *this_01 = (NotDefSymbol)0x0;
      NotDefSymbol::NotDefSymbol(this_01);
      __cxa_throw(this_01,&NotDefSymbol::typeinfo,NotDefSymbol::~NotDefSymbol);
    }
    iStack_b8 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assembler::symbolTableEntry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assembler::symbolTableEntry>_>_>
                ::find(&this->symbolTable,line);
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assembler::symbolTableEntry>_>
             ::operator->(&stack0xffffffffffffff48);
    if ((ppVar2->second).section == -1) {
      local_c8._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assembler::symbolTableEntry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assembler::symbolTableEntry>_>_>
           ::find(&this->symbolTable,line);
      ppVar2 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assembler::symbolTableEntry>_>
               ::operator->(&local_c8);
      local_bc = (ppVar2->second).value;
      processWordHelper(this,local_bc);
      locationCounter = locationCounter + 2;
      symbol._M_begin._M_current._4_4_ = 1;
    }
    else {
      iStack_d0 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assembler::symbolTableEntry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assembler::symbolTableEntry>_>_>
                  ::find(&this->symbolTable,line);
      ppVar2 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assembler::symbolTableEntry>_>
               ::operator->(&stack0xffffffffffffff30);
      if ((((ppVar2->second).isGlobal ^ 0xffU) & 1) == 0) {
        processWordHelper(this,0);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_1f8,"",&local_1f9);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_220,"",&local_221);
        relocationTableEntry::relocationTableEntry
                  ((relocationTableEntry *)local_1d8,0,&local_1f8,-1,&local_220);
        std::__cxx11::string::~string((string *)&local_220);
        std::allocator<char>::~allocator(&local_221);
        std::__cxx11::string::~string((string *)&local_1f8);
        std::allocator<char>::~allocator(&local_1f9);
        local_1d8._0_4_ = locationCounter;
        std::__cxx11::string::operator=((string *)&rT_1,"R_386_16");
        local_230._M_node =
             (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assembler::symbolTableEntry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assembler::symbolTableEntry>_>_>
             ::find(&this->symbolTable,line);
        ppVar2 = std::
                 _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assembler::symbolTableEntry>_>
                 ::operator->(&local_230);
        rT_1.typeOfRelocation.field_2._8_4_ = (ppVar2->second).id;
        pmVar3 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<Assembler::relocationTableEntry,_std::allocator<Assembler::relocationTableEntry>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<Assembler::relocationTableEntry,_std::allocator<Assembler::relocationTableEntry>_>_>_>_>
                 ::operator[](&this->relocationTable,&currentSectionName_abi_cxx11_);
        std::__cxx11::
        list<Assembler::relocationTableEntry,_std::allocator<Assembler::relocationTableEntry>_>::
        push_back(pmVar3,(value_type *)local_1d8);
        locationCounter = locationCounter + 2;
        symbol._M_begin._M_current._4_4_ = 1;
        relocationTableEntry::~relocationTableEntry((relocationTableEntry *)local_1d8);
      }
      else {
        rT.section.field_2._8_8_ =
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assembler::symbolTableEntry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assembler::symbolTableEntry>_>_>
             ::find(&this->symbolTable,line);
        ppVar2 = std::
                 _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assembler::symbolTableEntry>_>
                 ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assembler::symbolTableEntry>_>
                               *)((long)&rT.section.field_2 + 8));
        processWordHelper(this,(ppVar2->second).value);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_150,"",&local_151);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_178,"",&local_179);
        relocationTableEntry::relocationTableEntry
                  ((relocationTableEntry *)local_130,0,&local_150,-1,&local_178);
        std::__cxx11::string::~string((string *)&local_178);
        std::allocator<char>::~allocator(&local_179);
        std::__cxx11::string::~string((string *)&local_150);
        std::allocator<char>::~allocator(&local_151);
        local_130._0_4_ = locationCounter;
        locationCounter = locationCounter + 2;
        std::__cxx11::string::operator=((string *)&rT,"R_386_16");
        rT_1.section.field_2._8_8_ =
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assembler::symbolTableEntry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assembler::symbolTableEntry>_>_>
             ::find(&this->symbolTable,line);
        ppVar2 = std::
                 _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assembler::symbolTableEntry>_>
                 ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assembler::symbolTableEntry>_>
                               *)((long)&rT_1.section.field_2 + 8));
        rT.typeOfRelocation.field_2._8_4_ = (ppVar2->second).section;
        pmVar3 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<Assembler::relocationTableEntry,_std::allocator<Assembler::relocationTableEntry>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<Assembler::relocationTableEntry,_std::allocator<Assembler::relocationTableEntry>_>_>_>_>
                 ::operator[](&this->relocationTable,&currentSectionName_abi_cxx11_);
        std::__cxx11::
        list<Assembler::relocationTableEntry,_std::allocator<Assembler::relocationTableEntry>_>::
        push_back(pmVar3,(value_type *)local_130);
        symbol._M_begin._M_current._4_4_ = 1;
        relocationTableEntry::~relocationTableEntry((relocationTableEntry *)local_130);
      }
    }
    std::__cxx11::
    match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::~match_results((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      *)local_90);
  }
  std::__cxx11::
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::~match_results((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    *)local_38);
  return;
}

Assistant:

void Assembler::processWordSecondPass(string line) {


    smatch literal;
    if (regex_match(line, literal, literalReg)) {

        int value = literalToDecimal(line);
        processWordHelper(value);
        locationCounter += 2;
        return;
    }
    smatch symbol;
    if (symbolTable.find(line) == symbolTable.end()) throw NotDefWordSecondPassError();
    if (regex_match(line, symbol, symbolReg)) {

        if (symbolTable.find(line) == symbolTable.end()) throw NotDefSymbol();

        if (symbolTable.find(line)->second.section == -1) {

            int value = symbolTable.find(line)->second.value;
            processWordHelper(value);
            locationCounter += 2;
            return;

        }

        if (!(symbolTable.find(line)->second.isGlobal)) {

            int value = symbolTable.find(line)->second.value;
            processWordHelper(value);
            relocationTableEntry rT = relocationTableEntry();
            rT.offset = locationCounter;
            locationCounter += 2;
            rT.typeOfRelocation = "R_386_16";
            rT.value = symbolTable.find(line)->second.section;
            relocationTable[currentSectionName].push_back(rT);
            return;

        } else {
            processWordHelper(0);
            relocationTableEntry rT = relocationTableEntry();
            rT.offset = locationCounter;
            rT.typeOfRelocation = "R_386_16";
            rT.value = symbolTable.find(line)->second.id;
            relocationTable[currentSectionName].push_back(rT);
            locationCounter += 2;
            return;

        }
    }

    throw AfterWordError();


}